

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_test_utils.cpp
# Opt level: O1

void fade_up(float *out,float *in,size_t n)

{
  ulong uVar1;
  
  if (n != 0) {
    uVar1 = 0;
    do {
      out[uVar1] = (float)uVar1 * (1.0 / (float)n) * in[uVar1];
      uVar1 = uVar1 + 1;
    } while (n != uVar1);
  }
  return;
}

Assistant:

void fade_up(float *out, float *in, size_t n) {
  float i_scale = 1.0f / n;

  for (size_t i = 0; i < n; i++) {
    float a_v = (float)i * i_scale;
    out[i] = a_v * in[i];
  }
}